

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_3U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_3U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  pointer puVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  allocator_type local_41;
  uint local_40;
  uint local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  if ((targetBits < 0x21) && ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) != 0)) {
    bVar5 = (byte)targetBits;
    local_3c = ~(-1 << ((byte)sBits & 0x1f)) << (bVar5 - (byte)sBits & 0x1f);
    local_40 = -1;
    uVar17 = 0;
    local_38 = __return_storage_ptr__;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((targetBits >> 3) * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_41);
    auVar7 = _DAT_00181500;
    auVar6 = _DAT_001814f0;
    if ((this->super_Image).height != 0) {
      uVar2 = -(uint)(sBits == 0) | local_3c;
      local_40 = local_40 << (bVar5 & 0x1f);
      uVar16 = (ulong)targetBits - 1;
      auVar24._8_4_ = (int)uVar16;
      auVar24._0_8_ = uVar16;
      auVar24._12_4_ = (int)(uVar16 >> 0x20);
      auVar18._0_8_ = uVar16 >> 3;
      auVar18._8_8_ = auVar24._8_8_ >> 3;
      auVar18 = auVar18 ^ _DAT_00181500;
      do {
        if ((this->super_Image).width != 0) {
          uVar8 = 0;
          do {
            if (numChannels != 0) {
              if (0x1f < targetBits - 1) {
                __assert_fail("targetBits > 0 && targetBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xef,"uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
              }
              uVar10 = 0;
              do {
                uVar11 = (this->super_Image).width * uVar17 + uVar8;
                uVar9 = (uint)uVar10;
                uVar15 = 2;
                if (uVar9 < 2) {
                  uVar15 = uVar10;
                }
                bVar3 = this->pixels[uVar11].field_0.comps[uVar15];
                uVar12 = (uint)bVar3;
                uVar14 = uVar12;
                if (targetBits != 8) {
                  if (targetBits < 8) {
                    uVar14 = (uint)(bVar3 >> (8 - bVar5 & 0x1f));
                    if ((1 << (7 - bVar5 & 0x1f) & uVar12) != 0) {
                      uVar12 = -uVar14 - 2;
                      if (-uVar14 - 2 < local_40) {
                        uVar12 = local_40;
                      }
                      uVar14 = ~uVar12;
                    }
                  }
                  else {
                    lVar13 = 2;
                    auVar19 = ZEXT816(0);
                    iVar22 = 0;
                    do {
                      auVar24 = auVar19;
                      auVar19._0_8_ = ((ulong)uVar12 << (ulong)(targetBits - iVar22)) >> 8;
                      auVar19._8_8_ = 0;
                      auVar19 = auVar19 | auVar24;
                      iVar22 = iVar22 + 0x10;
                      lVar1 = ((uVar16 >> 3) + 2 & 0xfffffffffffffffe) + lVar13;
                      lVar13 = lVar13 + -2;
                    } while (lVar1 != 4);
                    lVar13 = -lVar13;
                    auVar20._8_4_ = (int)lVar13;
                    auVar20._0_8_ = lVar13;
                    auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
                    auVar20 = (auVar20 | auVar6) ^ auVar7;
                    iVar22 = -(uint)(auVar18._0_4_ < auVar20._0_4_);
                    auVar23._4_4_ = -(uint)(auVar18._4_4_ < auVar20._4_4_);
                    iVar25 = -(uint)(auVar18._8_4_ < auVar20._8_4_);
                    auVar23._12_4_ = -(uint)(auVar18._12_4_ < auVar20._12_4_);
                    auVar26._4_4_ = iVar22;
                    auVar26._0_4_ = iVar22;
                    auVar26._8_4_ = iVar25;
                    auVar26._12_4_ = iVar25;
                    auVar21._4_4_ = -(uint)(auVar20._4_4_ == auVar18._4_4_);
                    auVar21._12_4_ = -(uint)(auVar20._12_4_ == auVar18._12_4_);
                    auVar21._0_4_ = auVar21._4_4_;
                    auVar21._8_4_ = auVar21._12_4_;
                    auVar23._0_4_ = auVar23._4_4_;
                    auVar23._8_4_ = auVar23._12_4_;
                    auVar23 = auVar23 | auVar21 & auVar26;
                    auVar24 = ~auVar23 & auVar19 | auVar24 & auVar23;
                    uVar14 = auVar24._8_4_ | auVar24._0_4_;
                  }
                }
                puVar4 = (local_38->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar11 = (uVar11 * numChannels + uVar9) * (targetBits >> 3);
                if (targetBits == 0x20) {
                  *(uint *)(puVar4 + uVar11) = uVar14 & uVar2;
                }
                else if (targetBits == 0x10) {
                  *(ushort *)(puVar4 + uVar11) = (ushort)uVar14 & (ushort)uVar2;
                }
                else if (targetBits == 8) {
                  puVar4[uVar11] = (byte)uVar14 & (byte)uVar2;
                }
                uVar10 = (ulong)(uVar9 + 1);
              } while (uVar9 + 1 != numChannels);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (this->super_Image).width);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (this->super_Image).height);
    }
    return local_38;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x326,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }